

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_lib.c
# Opt level: O0

void DH_free(DH *dh)

{
  long lVar1;
  int i;
  int local_c;
  DH *local_8;
  
  if ((dh != (DH *)0x0) &&
     (local_8 = dh, CRYPTO_DOWN_REF((int *)&dh->engine,&local_c,dh[1].priv_key), local_c < 1)) {
    if ((local_8[1].pub_key != (BIGNUM *)0x0) &&
       (lVar1._0_4_ = local_8[1].pub_key[1].neg, lVar1._4_4_ = local_8[1].pub_key[1].flags,
       lVar1 != 0)) {
      (**(code **)&local_8[1].pub_key[1].neg)(local_8);
    }
    ENGINE_finish((ENGINE *)local_8[1].g);
    CRYPTO_free_ex_data(6,local_8,(CRYPTO_EX_DATA *)(local_8 + 1));
    CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x3b9fda);
    ossl_ffc_params_cleanup((FFC_PARAMS *)0x3b9fe8);
    BN_clear_free(*(BIGNUM **)&local_8->references);
    BN_clear_free((BIGNUM *)(local_8->ex_data).sk);
    CRYPTO_free(local_8);
  }
  return;
}

Assistant:

void DH_free(DH *r)
{
    int i;

    if (r == NULL)
        return;

    CRYPTO_DOWN_REF(&r->references, &i, r->lock);
    REF_PRINT_COUNT("DH", r);
    if (i > 0)
        return;
    REF_ASSERT_ISNT(i < 0);

    if (r->meth != NULL && r->meth->finish != NULL)
        r->meth->finish(r);
#if !defined(FIPS_MODULE)
# if !defined(OPENSSL_NO_ENGINE)
    ENGINE_finish(r->engine);
# endif
    CRYPTO_free_ex_data(CRYPTO_EX_INDEX_DH, r, &r->ex_data);
#endif

    CRYPTO_THREAD_lock_free(r->lock);

    ossl_ffc_params_cleanup(&r->params);
    BN_clear_free(r->pub_key);
    BN_clear_free(r->priv_key);
    OPENSSL_free(r);
}